

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

RC __thiscall
QO_Manager::NormalizeStats
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,float frac,float numTuples,int attrIdx1,int attrIdx2)

{
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  float fVar3;
  int attrIdx;
  _Rb_tree_color local_34;
  
  for (p_Var2 = (attr_stats->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(attr_stats->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    local_34 = p_Var2[1]._M_color;
    if (local_34 != attrIdx2 && local_34 != attrIdx1) {
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,(key_type *)&local_34);
      fVar3 = pmVar1->numTuples;
      if (numTuples <= pmVar1->numTuples) {
        fVar3 = numTuples;
      }
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,(key_type *)&local_34);
      pmVar1->numTuples = fVar3;
    }
  }
  return 0;
}

Assistant:

RC QO_Manager::NormalizeStats(map<int, attrStat> &attr_stats, float frac, float numTuples, int attrIdx1, int attrIdx2){
  map<int, attrStat>::iterator it;
  for(it = attr_stats.begin(); it != attr_stats.end(); ++it){
    int attrIdx = it->first;
    if(attrIdx != attrIdx1 && attrIdx != attrIdx2){
      attr_stats[attrIdx].numTuples = min(numTuples, attr_stats[attrIdx].numTuples);
     // attr_stats[attrIdx].numTuples = attr_stats[attrIdx].numTuples*frac;
    }
  }
  return (0);
}